

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O3

void __thiscall zmq::pipe_t::send_disconnect_msg(pipe_t *this)

{
  msg_t *this_00;
  size_t sVar1;
  EVP_PKEY_CTX *ctx;
  
  this_00 = &this->_disconnect_msg;
  sVar1 = msg_t::size(this_00);
  if (sVar1 != 0) {
    rollback(this);
    ctx = (EVP_PKEY_CTX *)this_00;
    (*this->_out_pipe->_vptr_ypipe_base_t[2])(this->_out_pipe,this_00,0);
    flush(this);
    msg_t::init(this_00,ctx);
    return;
  }
  return;
}

Assistant:

void zmq::pipe_t::send_disconnect_msg ()
{
    if (_disconnect_msg.size () > 0) {
        // Rollback any incomplete message in the pipe, and push the disconnect message.
        rollback ();

        _out_pipe->write (_disconnect_msg, false);
        flush ();
        _disconnect_msg.init ();
    }
}